

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

pair<optional<Text>,_bool> * __thiscall
Patch::compute_old_text
          (pair<optional<Text>,_bool> *__return_storage_ptr__,Patch *this,
          optional<Text> *deleted_text,Point new_splice_start,Point new_deletion_end)

{
  TextSlice slice;
  TextSlice slice_00;
  TextSlice slice_01;
  bool bVar1;
  Text *text;
  bool local_2c9;
  Point local_2c8;
  Text *pTStack_2c0;
  Point local_2b8;
  bool local_2a1;
  optional<Text> local_2a0;
  Point local_260;
  Point local_258;
  Point local_250;
  TextSlice local_248;
  TextSlice local_230;
  Text *local_218;
  Text *pTStack_210;
  Point local_208;
  bool local_1f1;
  optional<Text> local_1f0;
  Point local_1b0;
  undefined1 auStack_1a8 [8];
  pair<TextSlice,_TextSlice> split_result;
  optional<Text> local_170;
  reference local_130;
  Change *change;
  iterator __end1;
  iterator __begin1;
  vector<Patch::Change,_std::allocator<Patch::Change>_> *__range1;
  Point deleted_text_slice_start;
  TextSlice deleted_text_slice;
  undefined1 local_d8 [8];
  vector<Patch::Change,_std::allocator<Patch::Change>_> overlapping_changes;
  Text result;
  bool local_71;
  optional<Text> local_70;
  optional<Text> *local_30;
  optional<Text> *deleted_text_local;
  Patch *this_local;
  Point new_deletion_end_local;
  Point new_splice_start_local;
  
  local_30 = deleted_text;
  deleted_text_local = (optional<Text> *)this;
  this_local = (Patch *)new_deletion_end;
  new_deletion_end_local = new_splice_start;
  bVar1 = ::optional::operator_cast_to_bool((optional *)deleted_text);
  if (bVar1) {
    Text::Text((Text *)&overlapping_changes.
                        super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    grab_changes_in_range<Patch::NewCoordinates>
              ((vector<Patch::Change,_std::allocator<Patch::Change>_> *)local_d8,this,
               new_deletion_end_local,(Point)this_local,(bool)(this->merges_adjacent_changes & 1));
    text = optional<Text>::operator*(local_30);
    TextSlice::TextSlice((TextSlice *)&deleted_text_slice_start,text);
    __range1 = (vector<Patch::Change,_std::allocator<Patch::Change>_> *)new_deletion_end_local;
    __end1 = std::vector<Patch::Change,_std::allocator<Patch::Change>_>::begin
                       ((vector<Patch::Change,_std::allocator<Patch::Change>_> *)local_d8);
    change = (Change *)
             std::vector<Patch::Change,_std::allocator<Patch::Change>_>::end
                       ((vector<Patch::Change,_std::allocator<Patch::Change>_> *)local_d8);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Patch::Change_*,_std::vector<Patch::Change,_std::allocator<Patch::Change>_>_>
                                       *)&change), bVar1) {
      local_130 = __gnu_cxx::
                  __normal_iterator<Patch::Change_*,_std::vector<Patch::Change,_std::allocator<Patch::Change>_>_>
                  ::operator*(&__end1);
      if (local_130->old_text == (Text *)0x0) {
        optional<Text>::optional(&local_170);
        split_result.second.end_position.column._3_1_ = 1;
        std::pair<optional<Text>,_bool>::pair<optional<Text>,_bool,_true>
                  (__return_storage_ptr__,&local_170,
                   (bool *)((long)&split_result.second.end_position.column + 3));
        optional<Text>::~optional(&local_170);
        goto LAB_001aa9bf;
      }
      bVar1 = Point::operator>(&local_130->new_start,(Point *)&__range1);
      if (bVar1) {
        local_1b0 = Point::traversal(&local_130->new_start,(Point *)&__range1);
        TextSlice::split((pair<TextSlice,_TextSlice> *)auStack_1a8,
                         (TextSlice *)&deleted_text_slice_start,local_1b0);
        bVar1 = TextSlice::is_valid((TextSlice *)auStack_1a8);
        if (!bVar1) {
          optional<Text>::optional(&local_1f0);
          local_1f1 = false;
          std::pair<optional<Text>,_bool>::pair<optional<Text>,_bool,_true>
                    (__return_storage_ptr__,&local_1f0,&local_1f1);
          optional<Text>::~optional(&local_1f0);
          goto LAB_001aa9bf;
        }
        __range1 = *(vector<Patch::Change,_std::allocator<Patch::Change>_> **)&local_130->new_start;
        deleted_text_slice_start = split_result.first.end_position;
        local_208 = split_result.first.start_position;
        local_218 = (Text *)auStack_1a8;
        pTStack_210 = split_result.first.text;
        slice.start_position = (Point)split_result.first.text;
        slice.text = (Text *)auStack_1a8;
        slice.end_position = split_result.first.start_position;
        Text::append((Text *)&overlapping_changes.
                              super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,slice);
      }
      TextSlice::TextSlice(&local_230,local_130->old_text);
      slice_00.start_position = local_230.start_position;
      slice_00.text = local_230.text;
      slice_00.end_position = local_230.end_position;
      Text::append((Text *)&overlapping_changes.
                            super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,slice_00);
      local_258 = TextSlice::extent((TextSlice *)&deleted_text_slice_start);
      local_260 = Point::traversal(&local_130->new_end,(Point *)&__range1);
      local_250 = Point::min(&local_258,&local_260);
      TextSlice::suffix(&local_248,(TextSlice *)&deleted_text_slice_start,local_250);
      deleted_text_slice.start_position = local_248.end_position;
      deleted_text_slice_start = (Point)local_248.text;
      deleted_text_slice.text = (Text *)local_248.start_position;
      __range1 = *(vector<Patch::Change,_std::allocator<Patch::Change>_> **)&local_130->new_end;
      bVar1 = TextSlice::is_valid((TextSlice *)&deleted_text_slice_start);
      if (!bVar1) {
        optional<Text>::optional(&local_2a0);
        local_2a1 = false;
        std::pair<optional<Text>,_bool>::pair<optional<Text>,_bool,_true>
                  (__return_storage_ptr__,&local_2a0,&local_2a1);
        optional<Text>::~optional(&local_2a0);
        goto LAB_001aa9bf;
      }
      __gnu_cxx::
      __normal_iterator<Patch::Change_*,_std::vector<Patch::Change,_std::allocator<Patch::Change>_>_>
      ::operator++(&__end1);
    }
    local_2b8 = deleted_text_slice.start_position;
    local_2c8 = deleted_text_slice_start;
    pTStack_2c0 = deleted_text_slice.text;
    slice_01.start_position = (Point)deleted_text_slice.text;
    slice_01.text = (Text *)deleted_text_slice_start;
    slice_01.end_position = deleted_text_slice.start_position;
    Text::append((Text *)&overlapping_changes.
                          super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,slice_01);
    local_2c9 = true;
    std::pair<optional<Text>,_bool>::pair<Text_&,_bool,_true>
              (__return_storage_ptr__,
               (Text *)&overlapping_changes.
                        super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,&local_2c9);
LAB_001aa9bf:
    split_result.second.end_position.row = 1;
    std::vector<Patch::Change,_std::allocator<Patch::Change>_>::~vector
              ((vector<Patch::Change,_std::allocator<Patch::Change>_> *)local_d8);
    Text::~Text((Text *)&overlapping_changes.
                         super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  }
  else {
    optional<Text>::optional(&local_70);
    local_71 = true;
    std::pair<optional<Text>,_bool>::pair<optional<Text>,_bool,_true>
              (__return_storage_ptr__,&local_70,&local_71);
    optional<Text>::~optional(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<optional<Text>, bool> Patch::compute_old_text(
  optional<Text> &&deleted_text, Point new_splice_start, Point new_deletion_end
) {
  if (!deleted_text) return {optional<Text>{}, true};

  Text result;

  auto overlapping_changes = grab_changes_in_range<NewCoordinates>(
    new_splice_start,
    new_deletion_end,
    merges_adjacent_changes
  );

  TextSlice deleted_text_slice = TextSlice(*deleted_text);
  Point deleted_text_slice_start = new_splice_start;

  for (const Change &change : overlapping_changes) {
    if (!change.old_text) return {optional<Text>{}, true};

    if (change.new_start > deleted_text_slice_start) {
      auto split_result = deleted_text_slice.split(
        change.new_start.traversal(deleted_text_slice_start)
      );
      if (!split_result.first.is_valid()) return {optional<Text>{}, false};
      deleted_text_slice_start = change.new_start;
      deleted_text_slice = split_result.second;
      result.append(split_result.first);
    }

    result.append(*change.old_text);
    deleted_text_slice = deleted_text_slice.suffix(Point::min(
      deleted_text_slice.extent(),
      change.new_end.traversal(deleted_text_slice_start)
    ));
    deleted_text_slice_start = change.new_end;

    if (!deleted_text_slice.is_valid()) return {optional<Text>{}, false};
  }

  result.append(deleted_text_slice);
  return {result, true};
}